

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

xmlSchematronParserCtxtPtr xmlSchematronNewDocParserCtxt(xmlDocPtr doc)

{
  _xmlNode *p_Var1;
  xmlXPathContextPtr pxVar2;
  xmlSchematronParserCtxtPtr ret;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x90);
    if (doc_local == (xmlDocPtr)0x0) {
      xmlSchematronPErrMemory((xmlSchematronParserCtxtPtr)0x0);
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x90);
      doc_local->name = (char *)doc;
      p_Var1 = (_xmlNode *)xmlDictCreate();
      doc_local->next = p_Var1;
      *(int *)&doc_local->children = 1;
      pxVar2 = xmlXPathNewContext(doc);
      doc_local->doc = (_xmlDoc *)pxVar2;
      if ((xmlXPathContextPtr_conflict)doc_local->doc == (xmlXPathContextPtr_conflict)0x0) {
        xmlSchematronPErrMemory((xmlSchematronParserCtxtPtr)0x0);
        xmlSchematronFreeParserCtxt((xmlSchematronParserCtxtPtr)doc_local);
        doc_local = (xmlDocPtr)0x0;
      }
    }
  }
  return (xmlSchematronParserCtxtPtr)doc_local;
}

Assistant:

xmlSchematronParserCtxtPtr
xmlSchematronNewDocParserCtxt(xmlDocPtr doc)
{
    xmlSchematronParserCtxtPtr ret;

    if (doc == NULL)
        return (NULL);

    ret =
        (xmlSchematronParserCtxtPtr)
        xmlMalloc(sizeof(xmlSchematronParserCtxt));
    if (ret == NULL) {
        xmlSchematronPErrMemory(NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronParserCtxt));
    ret->doc = doc;
    ret->dict = xmlDictCreate();
    /* The application has responsibility for the document */
    ret->preserve = 1;
    ret->xctxt = xmlXPathNewContext(doc);
    if (ret->xctxt == NULL) {
        xmlSchematronPErrMemory(NULL);
        xmlSchematronFreeParserCtxt(ret);
        return (NULL);
    }

    return (ret);
}